

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FigureTests-v2.cpp
# Opt level: O0

void __thiscall
v2::FigureTests_v2_clonning_const_figure_Test::TestBody
          (FigureTests_v2_clonning_const_figure_Test *this)

{
  bool bVar1;
  char *message;
  char *in_R9;
  string local_80;
  AssertHelper local_60;
  Message local_58;
  undefined1 local_50 [8];
  AssertionResult gtest_ar_;
  unique_ptr<v2::Square,_std::default_delete<v2::Square>_> local_30;
  unique_ptr<v2::Square,_std::default_delete<v2::Square>_> figure;
  Square square;
  FigureTests_v2_clonning_const_figure_Test *this_local;
  
  figure._M_t.super___uniq_ptr_impl<v2::Square,_std::default_delete<v2::Square>_>._M_t.
  super__Tuple_impl<0UL,_v2::Square_*,_std::default_delete<v2::Square>_>.
  super__Head_base<0UL,_v2::Square_*,_false>._M_head_impl =
       (__uniq_ptr_data<v2::Square,_std::default_delete<v2::Square>,_true,_true>)
       (__uniq_ptr_impl<v2::Square,_std::default_delete<v2::Square>_>)0x0;
  v2::Square::Square((Square *)&figure);
  clone<v2::Square>((v2 *)&local_30,(Square *)&figure);
  testing::AssertionResult::AssertionResult((AssertionResult *)local_50,true);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_50);
  if (!bVar1) {
    testing::Message::Message(&local_58);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_80,(internal *)local_50,
               (AssertionResult *)"(std::is_same<std::unique_ptr<Square>, decltype(figure)>::value)"
               ,"false","true",in_R9);
    message = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_60,kFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/CppCodeReviewers[P]Covariant-Return-Types-and-Smart-Pointers/FigureTests-v2.cpp"
               ,0x56,message);
    testing::internal::AssertHelper::operator=(&local_60,&local_58);
    testing::internal::AssertHelper::~AssertHelper(&local_60);
    std::__cxx11::string::~string((string *)&local_80);
    testing::Message::~Message(&local_58);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_50);
  std::unique_ptr<v2::Square,_std::default_delete<v2::Square>_>::~unique_ptr(&local_30);
  v2::Square::~Square((Square *)&figure);
  return;
}

Assistant:

TEST(FigureTests_v2, clonning_const_figure)
{
    const auto square = Square{};
    auto figure = clone(square);

    ASSERT_TRUE((std::is_same<std::unique_ptr<Square>, decltype(figure)>::value));
}